

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::VerifyReferencedPropertyIdMap(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  int *piVar5;
  ulong uVar6;
  
  uVar3 = GetReferencedPropertyIdCount(this);
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar6 = 0;
  do {
    if (uVar3 == uVar6) {
      return;
    }
    piVar5 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)17,int*>
                       ((FunctionProxy *)this);
    if (piVar5[uVar6] == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x10d1,
                                  "(this->GetReferencedPropertyIdMap()[i] != Js::Constants::NoProperty)"
                                  ,
                                  "this->GetReferencedPropertyIdMap()[i] != Js::Constants::NoProperty"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void FunctionBody::VerifyReferencedPropertyIdMap()
    {
        uint count = this->GetReferencedPropertyIdCount();
        for (uint i = 0; i < count; i++)
        {
            Assert(this->GetReferencedPropertyIdMap()[i] != Js::Constants::NoProperty);
        }
    }